

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

int zip_resolve_symlink(PHYSFS_Io *io,ZIPinfo *info,ZIPentry *entry)

{
  PHYSFS_uint16 entryversion;
  size_t _len;
  ulong len;
  undefined8 uVar1;
  mz_internal_state *pmVar2;
  mz_free_func p_Var3;
  void *pvVar4;
  ZIPinfo *info_00;
  PHYSFS_Io *pPVar5;
  int iVar6;
  uint rc;
  uchar *path;
  uchar *puVar7;
  uchar *puVar8;
  size_t sVar9;
  ZIPentry *entry_00;
  uchar *puVar10;
  uchar uVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 auStack_c8 [8];
  mz_stream local_c0;
  ZIPinfo *local_50;
  uchar *local_48;
  PHYSFS_Io *local_40;
  uchar *local_38;
  
  puVar13 = auStack_c8;
  _len = entry->uncompressed_size;
  local_50 = info;
  iVar6 = (*io->seek)(io,entry->offset);
  if (iVar6 == 0) {
    return 0;
  }
  if (_len + 1 < 0x100) {
    puVar13 = auStack_c8 + -(_len + 0x18 & 0xfffffffffffffff0);
    puVar12 = puVar13;
  }
  else {
    puVar12 = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar13 + -8) = 0x1155e3;
  path = (uchar *)__PHYSFS_initSmallAlloc(puVar12,_len + 1);
  if (path == (uchar *)0x0) {
    *(undefined8 *)(puVar13 + -8) = 2;
    uVar1 = *(undefined8 *)(puVar13 + -8);
    *(undefined8 *)(puVar13 + -8) = 0x115626;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar1);
    return 0;
  }
  local_40 = io;
  if (entry->compression_method == 0) {
    *(undefined8 *)(puVar13 + -8) = 0x11563b;
    iVar6 = __PHYSFS_readAll(io,path,_len);
  }
  else {
    len = entry->compressed_size;
    if (len < 0x100) {
      puVar13 = puVar13 + -(len + 0x17 & 0xfffffffffffffff0);
      puVar12 = puVar13;
    }
    else {
      puVar12 = (undefined1 *)0x0;
    }
    local_38 = (uchar *)0x0;
    *(undefined8 *)(puVar13 + -8) = 0x115652;
    puVar7 = (uchar *)__PHYSFS_initSmallAlloc(puVar12,len);
    pPVar5 = local_40;
    if (puVar7 != (uchar *)0x0) {
      *(undefined8 *)(puVar13 + -8) = 0x11566d;
      puVar8 = puVar7;
      iVar6 = __PHYSFS_readAll(pPVar5,puVar7,len);
      local_38 = (uchar *)0x0;
      local_48 = puVar7;
      if (iVar6 != 0) {
        local_c0.state = (mz_internal_state *)0x0;
        local_c0.total_in = 0;
        local_c0.reserved = 0;
        local_c0.data_type = 0;
        local_c0._92_4_ = 0;
        local_c0.adler = 0;
        local_c0.total_out = 0;
        local_c0.msg = (char *)0x0;
        local_c0.zalloc = zlibPhysfsAlloc;
        local_c0.zfree = zlibPhysfsFree;
        local_c0.opaque = &__PHYSFS_AllocatorHooks;
        local_c0._8_8_ = len & 0xffffffff;
        local_c0._32_8_ = _len & 0xffffffff;
        local_c0.next_in = puVar7;
        local_c0.next_out = path;
        *(undefined8 *)(puVar13 + -8) = 0x1156dd;
        iVar6 = mz_inflateInit2(&local_c0,(int)puVar8);
        *(undefined8 *)(puVar13 + -8) = 0x1156e7;
        zlib_err(iVar6);
        if (iVar6 == 0) {
          *(undefined8 *)(puVar13 + -8) = 4;
          uVar1 = *(undefined8 *)(puVar13 + -8);
          *(undefined8 *)(puVar13 + -8) = 0x1156fe;
          rc = mz_inflate(&local_c0,(int)uVar1);
          *(undefined8 *)(puVar13 + -8) = 0x115708;
          zlib_err(rc);
          pvVar4 = local_c0.opaque;
          p_Var3 = local_c0.zfree;
          pmVar2 = local_c0.state;
          if (local_c0.state != (mz_internal_state *)0x0) {
            *(undefined8 *)(puVar13 + -8) = 0x115718;
            (*p_Var3)(pvVar4,pmVar2);
            local_c0.state = (mz_internal_state *)0x0;
          }
          local_38 = (uchar *)(ulong)(rc < 2);
        }
      }
      puVar7 = local_48;
      *(undefined8 *)(puVar13 + -8) = 0x115733;
      __PHYSFS_smallFree(puVar7);
    }
    iVar6 = (int)local_38;
  }
  if (iVar6 == 0) goto LAB_0011586b;
  path[entry->uncompressed_size] = '\0';
  entryversion = entry->version;
  *(undefined8 *)(puVar13 + -8) = 0x115754;
  zip_convert_dos_path(entryversion,(char *)path);
  *(undefined8 *)(puVar13 + -8) = 0x2f;
  uVar1 = *(undefined8 *)(puVar13 + -8);
  puVar7 = path;
  local_38 = path;
  while( true ) {
    *(undefined8 *)(puVar13 + -8) = 0x11576d;
    puVar8 = (uchar *)strchr((char *)puVar7,(int)uVar1);
    info_00 = local_50;
    if (puVar8 == (uchar *)0x0) break;
    if (puVar8[1] == '.') {
      uVar11 = puVar8[2];
      puVar7 = puVar8;
      if (uVar11 == '\0') {
        *puVar8 = '\0';
      }
      else if (uVar11 == '/') {
        *(undefined8 *)(puVar13 + -8) = 0x1157a3;
        sVar9 = strlen((char *)(puVar8 + 2));
        *(undefined8 *)(puVar13 + -8) = 0x1157b2;
        memmove(puVar8,puVar8 + 2,sVar9 + 1);
      }
      else if (uVar11 == '.') {
        uVar11 = puVar8[3];
        if (uVar11 == '/') {
          *(undefined8 *)(puVar13 + -8) = 0x1157db;
          sVar9 = strlen((char *)(puVar8 + 4));
          puVar7 = local_38;
          *(undefined8 *)(puVar13 + -8) = 0x1157ee;
          memmove(puVar7,puVar8 + 4,sVar9 + 1);
          do {
            puVar10 = path;
            if (puVar7 == path) break;
            puVar8 = puVar7 + -1;
            puVar10 = puVar7;
            puVar7 = puVar7 + -1;
          } while (*puVar8 != '/');
          uVar11 = local_38[3];
          puVar8 = local_38;
          local_38 = puVar10;
        }
        puVar7 = puVar8;
        if (uVar11 == '\0') {
          *local_38 = '\0';
        }
      }
    }
    else {
      puVar7 = puVar8 + 1;
      local_38 = puVar8;
    }
  }
  *(undefined8 *)(puVar13 + -8) = 0x11583c;
  entry_00 = (ZIPentry *)__PHYSFS_DirTreeFind(&info_00->tree,(char *)path);
  pPVar5 = local_40;
  if (entry_00 == (ZIPentry *)0x0) {
LAB_00115864:
    entry_00 = (ZIPentry *)0x0;
  }
  else {
    *(undefined8 *)(puVar13 + -8) = 0x115853;
    iVar6 = zip_resolve(pPVar5,info_00,entry_00);
    if (iVar6 == 0) goto LAB_00115864;
    if (entry_00->symlink != (ZIPentry *)0x0) {
      entry_00 = entry_00->symlink;
    }
  }
  entry->symlink = entry_00;
LAB_0011586b:
  *(undefined8 *)(puVar13 + -8) = 0x115873;
  __PHYSFS_smallFree(path);
  return (uint)(entry->symlink != (_ZIPentry *)0x0);
}

Assistant:

static int zip_resolve_symlink(PHYSFS_Io *io, ZIPinfo *info, ZIPentry *entry)
{
    const size_t size = (size_t) entry->uncompressed_size;
    char *path = NULL;
    int rc = 0;

    /*
     * We've already parsed the local file header of the symlink at this
     *  point. Now we need to read the actual link from the file data and
     *  follow it.
     */

    BAIL_IF_ERRPASS(!io->seek(io, entry->offset), 0);

    path = (char *) __PHYSFS_smallAlloc(size + 1);
    BAIL_IF(!path, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    
    if (entry->compression_method == COMPMETH_NONE)
        rc = __PHYSFS_readAll(io, path, size);

    else  /* symlink target path is compressed... */
    {
        z_stream stream;
        const size_t complen = (size_t) entry->compressed_size;
        PHYSFS_uint8 *compressed = (PHYSFS_uint8*) __PHYSFS_smallAlloc(complen);
        if (compressed != NULL)
        {
            if (__PHYSFS_readAll(io, compressed, complen))
            {
                initializeZStream(&stream);
                stream.next_in = compressed;
                stream.avail_in = (unsigned int) complen;
                stream.next_out = (unsigned char *) path;
                stream.avail_out = (unsigned int) size;
                if (zlib_err(inflateInit2(&stream, -MAX_WBITS)) == Z_OK)
                {
                    rc = zlib_err(inflate(&stream, Z_FINISH));
                    inflateEnd(&stream);

                    /* both are acceptable outcomes... */
                    rc = ((rc == Z_OK) || (rc == Z_STREAM_END));
                } /* if */
            } /* if */
            __PHYSFS_smallFree(compressed);
        } /* if */
    } /* else */

    if (rc)
    {
        path[entry->uncompressed_size] = '\0';    /* null-terminate it. */
        zip_convert_dos_path(entry->version, path);
        entry->symlink = zip_follow_symlink(io, info, path);
    } /* else */

    __PHYSFS_smallFree(path);

    return (entry->symlink != NULL);
}